

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Httpd.cpp
# Opt level: O0

bool __thiscall xmrig::Httpd::start(Httpd *this)

{
  bool bVar1;
  uint16_t port;
  uint16_t uVar2;
  uint uVar3;
  uint uVar4;
  Config *this_00;
  Http *this_01;
  void *pvVar5;
  String *pSVar6;
  TcpServer *this_02;
  char *pcVar7;
  char *pcVar8;
  sockaddr *__addr;
  int __fd;
  long in_RDI;
  int rc;
  Http *config;
  IHttpListener *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  ITcpServerListener *in_stack_ffffffffffffffa8;
  undefined6 in_stack_ffffffffffffffb0;
  bool local_1;
  
  this_00 = Base::config(*(Base **)(in_RDI + 0x10));
  this_01 = BaseConfig::http(&this_00->super_BaseConfig);
  bVar1 = Http::isEnabled(this_01);
  if (bVar1) {
    pvVar5 = operator_new(0x10);
    HttpServer::HttpServer
              ((HttpServer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff98);
    *(void **)(in_RDI + 0x18) = pvVar5;
    pSVar6 = (String *)operator_new(0xa8);
    this_02 = (TcpServer *)Http::host(this_01);
    port = Http::port(this_01);
    __fd = (int)this_02;
    TcpServer::TcpServer(this_02,pSVar6,port,in_stack_ffffffffffffffa8);
    *(String **)(in_RDI + 0x20) = pSVar6;
    uVar3 = TcpServer::bind(*(TcpServer **)(in_RDI + 0x20),__fd,__addr,(socklen_t)pSVar6);
    pSVar6 = Http::host(this_01);
    pcVar7 = String::data(pSVar6);
    if ((int)uVar3 < 0) {
      uVar2 = Http::port(this_01);
      uVar4 = (uint)uVar2;
      pcVar8 = (char *)uv_strerror(uVar3);
    }
    else {
      pcVar8 = "";
      uVar4 = uVar3;
    }
    Log::print("\x1b[1;32m * \x1b[0m\x1b[1;37m%-13s\x1b[0m\x1b[1;34m%s:%d\x1b[0m \x1b[1;31m%s\x1b[0m"
               ,"HTTP API",pcVar7,(ulong)uVar4,pcVar8);
    if ((int)uVar3 < 0) {
      stop((Httpd *)CONCAT26(port,in_stack_ffffffffffffffb0));
      local_1 = false;
    }
    else {
      *(short *)(in_RDI + 0x28) = (short)uVar3;
      local_1 = true;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool xmrig::Httpd::start()
{
    const Http &config = m_base->config()->http();

    if (!config.isEnabled()) {
        return true;
    }

    m_http   = new HttpServer(this);
    m_server = new TcpServer(config.host(), config.port(), m_http);

    const int rc = m_server->bind();
    Log::print(GREEN_BOLD(" * ") WHITE_BOLD("%-13s") BLUE_BOLD("%s:%d") " " RED_BOLD("%s"),
               "HTTP API",
               config.host().data(),
               rc < 0 ? config.port() : rc,
               rc < 0 ? uv_strerror(rc) : ""
               );

    if (rc < 0) {
        stop();

        return false;
    }

    m_port = static_cast<uint16_t>(rc);

#   ifdef _WIN32
    HRSRC src = FindResource(nullptr, MAKEINTRESOURCE(1), RT_ICON);
    if (src != nullptr) {
        HGLOBAL res = LoadResource(nullptr, src);
        if (res != nullptr) {
            favicon     = static_cast<const char *>(LockResource(res));
            faviconSize = SizeofResource(nullptr, src);
        }
    }
#   endif

    return true;
}